

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O1

void __thiscall Rml::Element::SetDataModel(Element *this,DataModel *new_data_model)

{
  DataModel *this_00;
  pointer puVar1;
  code *pcVar2;
  bool bVar3;
  ElementPtr *child;
  pointer puVar4;
  
  if ((new_data_model != (DataModel *)0x0) && (this->data_model != (DataModel *)0x0)) {
    bVar3 = Assert("We must either attach a new data model, or detach the old one.",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Element.cpp"
                   ,0x83d);
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
  }
  this_00 = this->data_model;
  if ((this_00 != new_data_model) &&
     (new_data_model == (DataModel *)0x0 || this_00 == (DataModel *)0x0)) {
    if (this_00 != (DataModel *)0x0) {
      DataModel::OnElementRemove(this_00,this);
    }
    this->data_model = new_data_model;
    if (new_data_model != (DataModel *)0x0) {
      ElementUtilities::ApplyDataViewsControllers(this);
    }
    puVar1 = (this->children).
             super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar4 = (this->children).
                  super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1)
    {
      SetDataModel((puVar4->_M_t).super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
                   _M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                   super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,new_data_model);
    }
  }
  return;
}

Assistant:

void Element::SetDataModel(DataModel* new_data_model)
{
	RMLUI_ASSERTMSG(!data_model || !new_data_model, "We must either attach a new data model, or detach the old one.");

	if (data_model == new_data_model)
		return;

	// stop descent if a nested data model is encountered
	if (data_model && new_data_model && data_model != new_data_model)
		return;

	if (data_model)
		data_model->OnElementRemove(this);

	data_model = new_data_model;

	if (data_model)
		ElementUtilities::ApplyDataViewsControllers(this);

	for (ElementPtr& child : children)
		child->SetDataModel(new_data_model);
}